

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O3

int32_t calculate_value_from_formula_depth(borg_array *f,int *i,int pdepth,int range_index)

{
  int iVar1;
  int *piVar2;
  void **ppvVar3;
  undefined4 *puVar4;
  uint uVar5;
  uint uVar6;
  
  piVar2 = (int *)f->items[*i];
  if (pdepth < piVar2[4]) {
    uVar5 = calculate_value_from_formula_depth(f,i,pdepth + 1,range_index);
  }
  else {
    if (*piVar2 == 1) {
      uVar5 = calculate_from_value(*(value_sec **)(piVar2 + 2),range_index);
    }
    else {
      uVar5 = 0;
      if (*piVar2 != 2) goto LAB_00223d3c;
      uVar5 = **(uint **)(piVar2 + 2);
    }
    if ((char)piVar2[1] == '\x01') {
      uVar5 = (uint)(uVar5 == 0);
    }
  }
LAB_00223d3c:
  iVar1 = *i;
  if (f->count <= iVar1 + 1) {
    return uVar5;
  }
  ppvVar3 = f->items;
  puVar4 = (undefined4 *)ppvVar3[(long)iVar1 + 1];
  if ((int)puVar4[4] < pdepth) {
    return uVar5;
  }
  *i = iVar1 + 2;
  piVar2 = (int *)ppvVar3[(long)iVar1 + 2];
  if (pdepth < piVar2[4]) {
    uVar6 = calculate_value_from_formula_depth(f,i,pdepth + 1,range_index);
  }
  else {
    if (*piVar2 == 1) {
      uVar6 = calculate_from_value(*(value_sec **)(piVar2 + 2),range_index);
    }
    else {
      uVar6 = 0;
      if (*piVar2 != 2) goto LAB_00223dbc;
      uVar6 = **(uint **)(piVar2 + 2);
    }
    if ((char)piVar2[1] == '\x01') {
      uVar6 = (uint)(uVar6 == 0);
    }
  }
LAB_00223dbc:
  switch(*puVar4) {
  case 3:
    uVar5 = uVar5 - uVar6;
    break;
  case 4:
    uVar5 = uVar5 + uVar6;
    break;
  case 5:
    uVar5 = uVar5 * uVar6;
    break;
  case 6:
    uVar5 = (int)uVar5 / (int)uVar6;
    break;
  case 7:
    uVar5 = (uint)(uVar6 != 0 && uVar5 != 0);
    break;
  case 8:
    uVar5 = (uint)(uVar5 != 0 || uVar6 != 0);
    break;
  case 9:
    uVar5 = (uint)(uVar5 == uVar6);
    break;
  case 10:
    uVar5 = (uint)((int)uVar5 < (int)uVar6);
    break;
  case 0xb:
    uVar5 = (uint)((int)uVar6 < (int)uVar5);
    break;
  case 0xc:
    uVar5 = (uint)((int)uVar5 <= (int)uVar6);
    break;
  case 0xd:
    uVar5 = (uint)((int)uVar6 <= (int)uVar5);
    break;
  default:
    borg_note("** borg formula failure ** ");
    borg_note("** error calculating a formula value");
    uVar5 = 0;
  }
  if ((*i + 1 < f->count) && (*(int *)((long)f->items[(long)*i + 1] + 0x10) == pdepth)) {
    borg_note("** borg formula failure ** ");
    borg_note("** error calculating a formula value");
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

static int32_t calculate_value_from_formula_depth(
    struct borg_array *f, int *i, int pdepth, int range_index)
{
    struct token *left_token = (struct token *)f->items[*i];
    int32_t       left_value = 0;

    /* get the value on the left */
    if (left_token->pdepth > pdepth)
        left_value
            = calculate_value_from_formula_depth(f, i, pdepth + 1, range_index);
    else if (left_token->type == TOK_NUMBER) {
        left_value = *((int32_t *)left_token->token);
        if (left_token->not )
            left_value = !left_value;
    } else if (left_token->type == TOK_VALUE) {
        left_value = calculate_from_value(
            (struct value_sec *)left_token->token, range_index);
        if (left_token->not )
            left_value = !left_value;
    }

    if ((*i) + 1 >= f->count)
        return left_value;

    struct token *operation = (struct token *)f->items[(*i) + 1];
    if (operation->pdepth < pdepth)
        return left_value;
    ++(*i);

    /* get the value on the right */
    int32_t       right_value = 0;
    struct token *right_token = (struct token *)f->items[++(*i)];
    if (right_token->pdepth > pdepth)
        right_value
            = calculate_value_from_formula_depth(f, i, pdepth + 1, range_index);
    else if (right_token->type == TOK_NUMBER) {
        right_value = *((int32_t *)right_token->token);
        if (right_token->not )
            right_value = !right_value;
    } else if (right_token->type == TOK_VALUE) {
        right_value = calculate_from_value(
            (struct value_sec *)right_token->token, range_index);
        if (right_token->not )
            right_value = !right_value;
    }

    int32_t total = 0;
    switch (operation->type) {
    case TOK_MINUS:
        total = left_value - right_value;
        break;
    case TOK_PLUS:
        total = left_value + right_value;
        break;
    case TOK_MULT:
        total = left_value * right_value;
        break;
    case TOK_DIV:
        total = left_value / right_value;
        break;
    case TOK_AND:
        total = left_value && right_value;
        break;
    case TOK_OR:
        total = left_value || right_value;
        break;
    case TOK_EQUALS:
        total = left_value == right_value;
        break;
    case TOK_LT:
        total = left_value < right_value;
        break;
    case TOK_GT:
        total = left_value > right_value;
        break;
    case TOK_LE:
        total = left_value <= right_value;
        break;
    case TOK_GE:
        total = left_value >= right_value;
        break;

    default: /* should never get here. */
        borg_note("** borg formula failure ** ");
        borg_note("** error calculating a formula value");
    }
    if ((*i) + 1 >= f->count)
        return total;
    struct token *next_token = (struct token *)f->items[(*i) + 1];
    if (next_token->pdepth != pdepth)
        return total;

    /* we should never get here.  The parsing should handle all validation */
    borg_note("** borg formula failure ** ");
    borg_note("** error calculating a formula value");
    return 0;
}